

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O1

void testReadMeta(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  char *in_RCX;
  exr_context_t f;
  float dlev;
  int zlev;
  void *udata;
  exr_attribute_t *newattr;
  string fn;
  int partidx;
  exr_context_initializer_t cinit;
  undefined8 local_d0;
  float local_c8;
  int local_c4;
  long local_c0;
  undefined1 local_b8 [8];
  long *local_b0 [2];
  long local_a0 [2];
  char local_8c [4];
  undefined8 local_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  std::__cxx11::string::append((char *)local_b0);
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_28 = 0;
  local_88 = 0x68;
  uStack_30 = 0xbf800000fffffffe;
  pcStack_80 = err_cb;
  iVar1 = exr_test_file_header(local_b0[0]);
  if (iVar1 == 0) {
    iVar1 = exr_start_read(&local_d0,local_b0[0],&local_88);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_0013f640;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013f656;
    }
    in_RCX = "box2i";
    iVar1 = exr_attr_declare_by_type(local_d0,0,"foo","box2i",local_b8);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_0013f695;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013f6ab;
    }
    in_RCX = (char *)0x1;
    iVar1 = exr_attr_declare(local_d0,0,"bar",1,local_b8);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_0013fc7b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fc91;
    }
    in_RCX = local_8c;
    iVar1 = exr_add_part(local_d0,"beauty",1);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_0013fcd0;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fce6;
    }
    iVar1 = exr_set_longname_support(local_d0,0);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_0013fd25;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fd3b;
    }
    iVar1 = exr_set_longname_support(local_d0,1);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_0013fd7a;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fd90;
    }
    local_c0 = 3;
    iVar1 = exr_get_user_data(0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(2);
      if (pcVar3 != (char *)0x0) goto LAB_0013fdcf;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fde5;
    }
    iVar1 = exr_get_user_data(local_d0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(3);
      if (pcVar3 != (char *)0x0) goto LAB_0013fe24;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fe3a;
    }
    local_c0 = 3;
    iVar1 = exr_get_user_data(local_d0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_user_data (f, &udata)",(char *)0x9b,0x1851dd,in_RCX);
LAB_0013fa78:
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fa8e:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_zip_compression_level (f, 0, &zlev)",(char *)0x9f,0x1851dd,in_RCX);
LAB_0013facd:
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fae3:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_0013fe79;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fe8f;
    }
    if (local_c0 != 0) {
      core_test_fail("udata == __null",(char *)0x9c,0x1851dd,in_RCX);
      iVar1 = 0;
LAB_0013f403:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_0013fa78;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fa8e;
    }
    local_c4 = -2;
    iVar1 = exr_get_zip_compression_level(local_d0,0);
    if (iVar1 != 0) goto LAB_0013f403;
    if (local_c4 != -1) {
      core_test_fail("zlev == -1",(char *)0xa0,0x1851dd,in_RCX);
      iVar1 = 0;
LAB_0013f489:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_0013facd;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fae3;
    }
    iVar1 = exr_set_zip_compression_level(local_d0,0,4);
    if (iVar1 != 8) goto LAB_0013f489;
    local_c8 = -3.0;
    iVar1 = exr_get_dwa_compression_level(local_d0,0);
    if (iVar1 == 0) {
      if ((local_c8 != 45.0) || (NAN(local_c8))) {
        core_test_fail("dlev == 45.f",(char *)0xa6,0x1851dd,in_RCX);
        iVar1 = 0;
      }
      else {
        iVar1 = exr_set_dwa_compression_level(0x42280000,local_d0,0);
        if (iVar1 == 8) {
          exr_finish(&local_d0);
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          return;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_0013fba4;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_dwa_compression_level (f, 0, &dlev)",(char *)0xa5,0x1851dd,in_RCX);
LAB_0013fba4:
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(8);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0013fee4;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_test_file_header (fn.c_str (), &cinit)",(char *)0x81,0x1851dd,in_RCX);
LAB_0013f640:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013f656:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x82,0x1851dd,in_RCX);
LAB_0013f695:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013f6ab:
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(8);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_declare_by_type (f, 0, \"foo\", \"box2i\", &newattr)",(char *)0x86,
                   0x1851dd,in_RCX);
LAB_0013fc7b:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fc91:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_declare (f, 0, \"bar\", EXR_ATTR_BOX2I, &newattr)",(char *)0x89,
                   0x1851dd,in_RCX);
LAB_0013fcd0:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fce6:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_add_part (f, \"beauty\", EXR_STORAGE_TILED, &partidx)",(char *)0x8e,0x1851dd
                   ,in_RCX);
LAB_0013fd25:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fd3b:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_set_longname_support (f, 0)",(char *)0x91,0x1851dd,in_RCX);
LAB_0013fd7a:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fd90:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_set_longname_support (f, 1)",(char *)0x93,0x1851dd,in_RCX);
LAB_0013fdcf:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fde5:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_user_data (__null, &udata)",(char *)0x97,0x1851dd,in_RCX);
LAB_0013fe24:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fe3a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_user_data (f, __null)",(char *)0x99,0x1851dd,in_RCX);
LAB_0013fe79:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fe8f:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_set_zip_compression_level (f, 0, 4)",(char *)0xa2,0x1851dd,in_RCX);
  }
  sVar4 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0013fee4:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_set_dwa_compression_level (f, 0, 42.f)",(char *)0xa8,0x1851dd,in_RCX);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}